

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::send
          (WebSocketPipeImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Coroutine<void> *this_00;
  long *plVar1;
  Promise<void> *promise;
  PromiseAwaiter<void> *pPVar2;
  kj *this_01;
  WebSocket *pWVar3;
  PromiseArenaMember *pPVar4;
  SourceLocation location;
  bool bVar5;
  coroutine_handle<void> coroutine;
  undefined4 in_register_00000034;
  WebSocketPipeImpl *adapterConstructorParams;
  
  adapterConstructorParams = (WebSocketPipeImpl *)CONCAT44(in_register_00000034,__fd);
  coroutine._M_fr_ptr = operator_new(0x5f0);
  *(code **)coroutine._M_fr_ptr = send;
  *(code **)((long)coroutine._M_fr_ptr + 8) = send;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(size_t *)((long)coroutine._M_fr_ptr + 0x5e0) = __n;
  *(WebSocketPipeImpl **)((long)coroutine._M_fr_ptr + 0x5d8) = adapterConstructorParams;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  location.function = "send";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xf16;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_WebSocket)._vptr_WebSocket = (_func_int **)this_00;
  pWVar3 = (adapterConstructorParams->state).ptr;
  if (pWVar3 == (WebSocket *)0x0) {
    pPVar2 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x3f0);
    this_01 = (kj *)((long)coroutine._M_fr_ptr + 0x5d0);
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x5a8) = 1;
    *(void **)((long)coroutine._M_fr_ptr + 0x5b0) = __buf;
    *(size_t *)((long)coroutine._M_fr_ptr + 0x5b8) = __n;
    newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
              (this_01,adapterConstructorParams,
               (OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                *)((long)coroutine._M_fr_ptr + 0x5a8));
    co_await<void>(pPVar2,(Promise<void> *)this_01);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5e8) = 1;
    bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
    if (bVar5) {
      return (ssize_t)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x408) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x410));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar2);
    pPVar4 = *(PromiseArenaMember **)this_01;
    if (pPVar4 != (PromiseArenaMember *)0x0) {
      *(undefined8 *)this_01 = 0;
      kj::_::PromiseDisposer::dispose(pPVar4);
    }
    ((OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
      *)((long)coroutine._M_fr_ptr + 0x5a8))->tag = 0;
  }
  else {
    promise = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x5c8);
    (*pWVar3->_vptr_WebSocket[1])(promise,pWVar3,__buf,__n);
    pPVar2 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
    co_await<void>(pPVar2,promise);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5e8) = 0;
    bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
    if (bVar5) {
      return (ssize_t)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar2);
    pPVar4 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar4 != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar4);
    }
  }
  plVar1 = (long *)(*(long *)((long)coroutine._M_fr_ptr + 0x5d8) + 0x40);
  *plVar1 = *plVar1 + *(long *)((long)coroutine._M_fr_ptr + 0x5e0);
  kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x5e9));
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5e8) = 2;
  return (ssize_t)this;
}

Assistant:

kj::Promise<void> send(kj::ArrayPtr<const char> message) override {
    KJ_IF_SOME(s, state) {
      co_await s.send(message);
    } else {
      co_await newAdaptedPromise<void, BlockedSend>(*this, MessagePtr(message));
    }